

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scurve.c
# Opt level: O0

void SCurvePosCtrl_New(SCurvePosCtrl_t *pSCurvePosCtrl,uint precision_level,float time_inc,
                      float cycle,float acc_step,float acc,float max_spd,float origin_pos,
                      float finish_pos)

{
  float finish_pos_local;
  float origin_pos_local;
  float max_spd_local;
  float acc_local;
  float acc_step_local;
  float cycle_local;
  float time_inc_local;
  uint precision_level_local;
  SCurvePosCtrl_t *pSCurvePosCtrl_local;
  
  pSCurvePosCtrl->Flag = '\0';
  pSCurvePosCtrl->Precision = precision_level;
  pSCurvePosCtrl->Time = 0.0;
  pSCurvePosCtrl->TimeInc = time_inc;
  pSCurvePosCtrl->Cycle = cycle;
  pSCurvePosCtrl->AccStep = acc_step;
  pSCurvePosCtrl->Acc = acc;
  pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
  pSCurvePosCtrl->MaxSpd = max_spd;
  pSCurvePosCtrl->OriginPos = origin_pos;
  pSCurvePosCtrl->FinishPos = finish_pos;
  pSCurvePosCtrl->Spd = 0.0;
  pSCurvePosCtrl->Pos = origin_pos;
  pSCurvePosCtrl->DeltaPos = pSCurvePosCtrl->FinishPos - pSCurvePosCtrl->OriginPos;
  if (ABS(pSCurvePosCtrl->Cycle) <= 0.0001) {
    SCurvePosCtrl_MaxSpdLimited(pSCurvePosCtrl);
  }
  else {
    SCurvePosCtrl_CycleLimited(pSCurvePosCtrl);
  }
  return;
}

Assistant:

void SCurvePosCtrl_New(SCurvePosCtrl_t *pSCurvePosCtrl, unsigned int precision_level, float time_inc, float cycle, float acc_step, float acc, float max_spd, float origin_pos, float finish_pos)
{
	pSCurvePosCtrl->Flag = 0;
	pSCurvePosCtrl->Precision = precision_level;
	pSCurvePosCtrl->Time = 0.0f;
	pSCurvePosCtrl->TimeInc = time_inc;
	pSCurvePosCtrl->Cycle = cycle;
	pSCurvePosCtrl->AccStep = acc_step;
	pSCurvePosCtrl->Acc = acc;
	pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
	pSCurvePosCtrl->MaxSpd = max_spd;
	pSCurvePosCtrl->OriginPos = origin_pos;
	pSCurvePosCtrl->FinishPos = finish_pos;

	pSCurvePosCtrl->Spd = 0.0f;
	pSCurvePosCtrl->Pos = origin_pos;

	pSCurvePosCtrl->DeltaPos = pSCurvePosCtrl->FinishPos - pSCurvePosCtrl->OriginPos;

	if (fabs(pSCurvePosCtrl->Cycle) > SCURVE_EQUAL_ERROR)
	{
		SCurvePosCtrl_CycleLimited(pSCurvePosCtrl);
	}
	else
	{
		SCurvePosCtrl_MaxSpdLimited(pSCurvePosCtrl);
	}
}